

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpivotgrowth.c
# Opt level: O2

float cPivotGrowth(int ncols,SuperMatrix *A,int *perm_c,SuperMatrix *L,SuperMatrix *U)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  void *addr;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  singlecomplex *psVar16;
  long lVar17;
  float fVar18;
  float fVar19;
  float local_b4;
  
  local_b4 = smach("S");
  pvVar3 = A->Store;
  pvVar4 = L->Store;
  pvVar5 = U->Store;
  lVar6 = *(long *)((long)pvVar3 + 8);
  lVar7 = *(long *)((long)pvVar4 + 8);
  lVar8 = *(long *)((long)pvVar5 + 8);
  addr = superlu_malloc((long)A->ncol << 2);
  for (lVar10 = 0; lVar10 < A->ncol; lVar10 = lVar10 + 1) {
    *(int *)((long)addr + (long)perm_c[lVar10] * 4) = (int)lVar10;
  }
  local_b4 = 1.0 / local_b4;
  lVar10 = 0;
  do {
    if (*(int *)((long)pvVar4 + 4) < lVar10) break;
    lVar15 = *(long *)((long)pvVar4 + 0x30);
    lVar13 = (long)*(int *)(lVar15 + lVar10 * 4);
    iVar1 = *(int *)(*(long *)((long)pvVar4 + 0x20) + 4 + lVar13 * 4);
    iVar2 = *(int *)(*(long *)((long)pvVar4 + 0x20) + lVar13 * 4);
    lVar11 = lVar7 + (long)*(int *)(*(long *)((long)pvVar4 + 0x10) + lVar13 * 4) * 8;
    lVar10 = lVar10 + 1;
    lVar17 = 8;
    while ((lVar13 < ncols && (lVar13 < *(int *)(lVar15 + lVar10 * 4)))) {
      lVar14 = (long)*(int *)((long)addr + lVar13 * 4);
      lVar15 = *(long *)((long)pvVar3 + 0x18);
      lVar12 = (long)*(int *)(lVar15 + lVar14 * 4);
      psVar16 = (singlecomplex *)(lVar6 + lVar12 * 8);
      fVar18 = 0.0;
      for (; lVar12 < *(int *)(lVar15 + 4 + lVar14 * 4); lVar12 = lVar12 + 1) {
        dVar9 = c_abs1(psVar16);
        if ((double)fVar18 <= dVar9) {
          dVar9 = c_abs1(psVar16);
          fVar18 = (float)dVar9;
        }
        lVar15 = *(long *)((long)pvVar3 + 0x18);
        psVar16 = psVar16 + 1;
      }
      lVar15 = *(long *)((long)pvVar5 + 0x18);
      lVar12 = (long)*(int *)(lVar15 + lVar13 * 4);
      lVar13 = lVar13 + 1;
      psVar16 = (singlecomplex *)(lVar8 + lVar12 * 8);
      fVar19 = 0.0;
      for (; lVar12 < *(int *)(lVar15 + lVar13 * 4); lVar12 = lVar12 + 1) {
        dVar9 = c_abs1(psVar16);
        if ((double)fVar19 <= dVar9) {
          dVar9 = c_abs1(psVar16);
          fVar19 = (float)dVar9;
        }
        lVar15 = *(long *)((long)pvVar5 + 0x18);
        psVar16 = psVar16 + 1;
      }
      for (lVar15 = 0; lVar17 != lVar15; lVar15 = lVar15 + 8) {
        dVar9 = c_abs1((singlecomplex *)(lVar11 + lVar15));
        if ((double)fVar19 <= dVar9) {
          dVar9 = c_abs1((singlecomplex *)(lVar11 + lVar15));
          fVar19 = (float)dVar9;
        }
      }
      fVar18 = (float)(-(uint)(fVar19 == 0.0) & 0x3f800000 |
                      ~-(uint)(fVar19 == 0.0) & (uint)(fVar18 / fVar19));
      if (fVar18 <= local_b4) {
        local_b4 = fVar18;
      }
      lVar17 = lVar17 + 8;
      lVar11 = lVar11 + (long)iVar1 * 8 + (long)iVar2 * -8;
      lVar15 = *(long *)((long)pvVar4 + 0x30);
    }
  } while (lVar13 < ncols);
  superlu_free(addr);
  return local_b4;
}

Assistant:

float
cPivotGrowth(int ncols, SuperMatrix *A, int *perm_c, 
             SuperMatrix *L, SuperMatrix *U)
{

    NCformat *Astore;
    SCformat *Lstore;
    NCformat *Ustore;
    singlecomplex  *Aval, *Lval, *Uval;
    int      fsupc, nsupr;
    int_t    luptr, nz_in_U;
    int_t    i, j, k, oldcol;
    int      *inv_perm_c;
    float   rpg, maxaj, maxuj;
    float   smlnum;
    singlecomplex   *luval;
   
    /* Get machine constants. */
    smlnum = smach("S");
    rpg = 1. / smlnum;

    Astore = A->Store;
    Lstore = L->Store;
    Ustore = U->Store;
    Aval = Astore->nzval;
    Lval = Lstore->nzval;
    Uval = Ustore->nzval;
    
    inv_perm_c = (int *) SUPERLU_MALLOC(A->ncol*sizeof(int));
    for (j = 0; j < A->ncol; ++j) inv_perm_c[perm_c[j]] = j;

    for (k = 0; k <= Lstore->nsuper; ++k) {
	fsupc = L_FST_SUPC(k);
	nsupr = L_SUB_START(fsupc+1) - L_SUB_START(fsupc);
	luptr = L_NZ_START(fsupc);
	luval = &Lval[luptr];
	nz_in_U = 1;
	
	for (j = fsupc; j < L_FST_SUPC(k+1) && j < ncols; ++j) {
	    maxaj = 0.;
            oldcol = inv_perm_c[j];
	    for (i = Astore->colptr[oldcol]; i < Astore->colptr[oldcol+1]; ++i)
		maxaj = SUPERLU_MAX( maxaj, c_abs1( &Aval[i]) );
	
	    maxuj = 0.;
	    for (i = Ustore->colptr[j]; i < Ustore->colptr[j+1]; i++)
		maxuj = SUPERLU_MAX( maxuj, c_abs1( &Uval[i]) );
	    
	    /* Supernode */
	    for (i = 0; i < nz_in_U; ++i)
		maxuj = SUPERLU_MAX( maxuj, c_abs1( &luval[i]) );

	    ++nz_in_U;
	    luval += nsupr;

	    if ( maxuj == 0. )
		rpg = SUPERLU_MIN( rpg, 1.);
	    else
		rpg = SUPERLU_MIN( rpg, maxaj / maxuj );
	}
	
	if ( j >= ncols ) break;
    }

    SUPERLU_FREE(inv_perm_c);
    return (rpg);
}